

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_point_read_string(mbedtls_ecp_point *P,int radix,char *x,char *y)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_read_string(&P->X,radix,x);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_read_string(&P->Y,radix,y);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_lset(&P->Z,1);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_point_read_string( mbedtls_ecp_point *P, int radix,
                           const char *x, const char *y )
{
    int ret;

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &P->X, radix, x ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &P->Y, radix, y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &P->Z, 1 ) );

cleanup:
    return( ret );
}